

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O3

void __thiscall
CEAngle::SetAngle(CEAngle *this,vector<double,_std::allocator<double>_> *angle_vec,
                 CEAngleType *angle_type)

{
  invalid_value *this_00;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (*angle_type == DMS) {
    SetAngle_DmsVect(this,angle_vec);
    return;
  }
  if (*angle_type == HMS) {
    SetAngle_HmsVect(this,angle_vec);
    return;
  }
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_38,"CEAngle::SetAngle(const std::vector<double>&, const CEAngleType&)"
             ,&local_5a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"[ERROR] Unknown angle type",&local_59);
  CEException::invalid_value::invalid_value(this_00,&local_38,&local_58);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

void CEAngle::SetAngle(const std::vector<double>& angle_vec,
                       const CEAngleType&         angle_type)
{
    // Hours minutes seconds
    if (angle_type == CEAngleType::HMS) {
        SetAngle_HmsVect(angle_vec);
    } 
    // Degrees arcmins arcseconds
    else if (angle_type == CEAngleType::DMS) {
        SetAngle_DmsVect(angle_vec);
    }
    // Otherwise, all done
    else {
        throw CEException::invalid_value(
            "CEAngle::SetAngle(const std::vector<double>&, const CEAngleType&)",
            "[ERROR] Unknown angle type");
    }
}